

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O3

int os_tmpname(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char buff [20];
  char acStack_28 [32];
  
  pcVar2 = tmpnam(acStack_28);
  if (pcVar2 == (char *)0x0) {
    iVar1 = luaL_error(L,"unable to generate a unique filename");
  }
  else {
    lua_pushstring(L,acStack_28);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int os_tmpname (lua_State *L) {
  char buff[LUA_TMPNAMBUFSIZE];
  int err;
  lua_tmpnam(buff, err);
  if (err)
    return luaL_error(L, "unable to generate a unique filename");
  lua_pushstring(L, buff);
  return 1;
}